

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3_api_wrapper.cpp
# Opt level: O0

int duckdb_shell_sqlite3_complete(char *zSql)

{
  char *in_RDI;
  bool bVar1;
  int c;
  idx_t delimiterLength;
  char *delimiterStart;
  char *start;
  idx_t idx;
  idx_t next_dollar;
  SQLParseState next_state;
  SQLParseState state;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  ulong local_28;
  ulong local_20;
  int local_18;
  int local_14;
  char *local_10;
  
  local_14 = 2;
  local_10 = in_RDI;
  do {
    if (*local_10 == '\0') {
      return (uint)(local_14 == 0);
    }
    switch(*local_10) {
    case '\t':
    case '\n':
    case '\f':
    case '\r':
    case ' ':
      local_18 = 1;
      break;
    default:
      local_18 = 2;
      break;
    case '\"':
    case '\'':
      in_stack_ffffffffffffffbc = (int)*local_10;
      do {
        local_10 = local_10 + 1;
        bVar1 = false;
        if (*local_10 != '\0') {
          bVar1 = *local_10 != in_stack_ffffffffffffffbc;
        }
      } while (bVar1);
      if (*local_10 == '\0') {
        return 0;
      }
      local_18 = 1;
      break;
    case '$':
      local_20 = 0;
      for (local_28 = 1; local_10[local_28] != '\0'; local_28 = local_28 + 1) {
        if (local_10[local_28] == '$') {
          local_20 = local_28;
          break;
        }
        if (((((local_10[local_28] < 'A') || ('Z' < local_10[local_28])) &&
             ((local_10[local_28] < 'a' || ('z' < local_10[local_28])))) &&
            ((local_10[local_28] < -0x80 || ((uint)(int)local_10[local_28] < 0x80000000)))) &&
           ((local_28 < 2 || ((local_10[local_28] < '0' || ('9' < local_10[local_28])))))) break;
      }
      if (local_20 == 0) {
        local_18 = 2;
      }
      else {
        local_10 = skipDollarQuotedString
                             (local_10 + 1,local_10 + (local_20 - (long)(local_10 + 1)),
                              CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
        if (local_10 == (char *)0x0) {
          return 0;
        }
        local_18 = 1;
      }
      break;
    case '-':
      if (local_10[1] == '-') {
        while( true ) {
          bVar1 = false;
          if (*local_10 != '\0') {
            bVar1 = *local_10 != '\n';
          }
          if (!bVar1) break;
          local_10 = local_10 + 1;
        }
        if (*local_10 == '\0') {
          return (uint)(local_14 == 0);
        }
        local_18 = 1;
      }
      else {
        local_18 = 2;
      }
      break;
    case '/':
      if (local_10[1] == '*') {
        local_10 = local_10 + 2;
        while( true ) {
          bVar1 = false;
          if ((*local_10 != '\0') && (bVar1 = true, *local_10 == '*')) {
            bVar1 = local_10[1] != '/';
          }
          if (!bVar1) break;
          local_10 = local_10 + 1;
        }
        if (*local_10 == '\0') {
          return 0;
        }
        local_10 = local_10 + 1;
        local_18 = 1;
      }
      else {
        local_18 = 2;
      }
      break;
    case ';':
      local_18 = 0;
    }
    if (local_18 != 1) {
      local_14 = local_18;
    }
    local_10 = local_10 + 1;
  } while( true );
}

Assistant:

int sqlite3_complete(const char *zSql) {
	auto state = SQLParseState::NORMAL;

	for (; *zSql; zSql++) {
		SQLParseState next_state;
		switch (*zSql) {
		case ';':
			next_state = SQLParseState::SEMICOLON;
			break;
		case ' ':
		case '\r':
		case '\t':
		case '\n':
		case '\f': { /* White space is ignored */
			next_state = SQLParseState::WHITESPACE;
			break;
		}
		case '/': { /* C-style comments */
			if (zSql[1] != '*') {
				next_state = SQLParseState::NORMAL;
				break;
			}
			zSql += 2;
			while (zSql[0] && (zSql[0] != '*' || zSql[1] != '/')) {
				zSql++;
			}
			if (zSql[0] == 0) {
				// unterminated c-style string
				return 0;
			}
			zSql++;
			next_state = SQLParseState::WHITESPACE;
			break;
		}
		case '-': { /* SQL-style comments from "--" to end of line */
			if (zSql[1] != '-') {
				next_state = SQLParseState::NORMAL;
				break;
			}
			while (*zSql && *zSql != '\n') {
				zSql++;
			}
			if (*zSql == 0) {
				// unterminated SQL-style comment - return whether or not we had a semicolon right before it
				return state == SQLParseState::SEMICOLON ? 1 : 0;
			}
			next_state = SQLParseState::WHITESPACE;
			break;
		}
		case '$': { /* Dollar-quoted strings */
			// check if this is a dollar-quoted string
			idx_t next_dollar = 0;
			for (idx_t idx = 1; zSql[idx]; idx++) {
				if (zSql[idx] == '$') {
					// found the next dollar
					next_dollar = idx;
					break;
				}
				// all characters can be between A-Z, a-z or \200 - \377
				if (zSql[idx] >= 'A' && zSql[idx] <= 'Z') {
					continue;
				}
				if (zSql[idx] >= 'a' && zSql[idx] <= 'z') {
					continue;
				}
				if (zSql[idx] >= '\200' && zSql[idx] <= '\377') {
					continue;
				}
				// the first character CANNOT be a numeric, only subsequent characters
				if (idx > 1 && zSql[idx] >= '0' && zSql[idx] <= '9') {
					continue;
				}
				// not a dollar quoted string
				break;
			}
			if (next_dollar == 0) {
				// not a dollar quoted string
				next_state = SQLParseState::NORMAL;
				break;
			}
			auto start = zSql + 1;
			zSql += next_dollar;
			const char *delimiterStart = start;
			idx_t delimiterLength = zSql - start;
			zSql++;
			// skip the dollar quoted string
			zSql = skipDollarQuotedString(zSql, delimiterStart, delimiterLength);
			if (!zSql) {
				// unterminated dollar string
				return 0;
			}
			next_state = SQLParseState::WHITESPACE;
			break;
		}
			//		case '`': /* Grave-accent quoted symbols used by MySQL */
		case '"': /* single- and double-quoted strings */
		case '\'': {
			int c = *zSql;
			zSql++;
			while (*zSql && *zSql != c) {
				zSql++;
			}
			if (*zSql == 0) {
				// unterminated single or double quoted string
				return 0;
			}
			next_state = SQLParseState::WHITESPACE;
			break;
		}
		default:
			next_state = SQLParseState::NORMAL;
		}
		// white space is ignored (no change in state)
		if (next_state != SQLParseState::WHITESPACE) {
			state = next_state;
		}
	}
	return state == SQLParseState::SEMICOLON ? 1 : 0;
}